

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

int __thiscall jpgd::jpeg_decoder::huff_decode(jpeg_decoder *this,huff_tables *pH,int *extra_bits)

{
  uint num_bits;
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint num_bits_00;
  uint num_bits_01;
  
  if (pH != (huff_tables *)0x0) {
    uVar3 = pH->look_up2[this->m_bit_buf >> 0x18];
    if ((int)uVar3 < 0) {
      iVar2 = -8;
      do {
        uVar3 = -(uint)((this->m_bit_buf >> (iVar2 + 0x1fU & 0x1f) & 1) != 0) - uVar3;
        if (((int)(iVar2 + 0x1fU) < 0) || (0x1ff < uVar3)) goto LAB_00154039;
        uVar3 = pH->tree[uVar3];
        iVar2 = iVar2 + -1;
      } while ((int)uVar3 < 0);
      get_bits_no_markers(this,-iVar2);
      uVar1 = get_bits_no_markers(this,uVar3 & 0xf);
      *extra_bits = uVar1;
    }
    else {
      if ((short)uVar3 < 0) {
        if ((uVar3 >> 0xc & 1) != 0) {
          __assert_fail("((symbol >> 8) & 31) <= 15",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                        ,0x250,"int jpgd::jpeg_decoder::huff_decode(huff_tables *, int &)");
        }
        get_bits_no_markers(this,uVar3 >> 8 & 0xf);
        uVar1 = uVar3 >> 0x10;
      }
      else {
        num_bits_00 = uVar3 >> 8 & 0x1f;
        num_bits_01 = uVar3 & 0xf;
        num_bits = num_bits_00 + num_bits_01;
        if (num_bits < 0x11) {
          uVar1 = get_bits_no_markers(this,num_bits);
          uVar1 = ~(-1 << (sbyte)num_bits_01) & uVar1;
        }
        else {
          get_bits_no_markers(this,num_bits_00);
          uVar1 = get_bits_no_markers(this,num_bits_01);
        }
      }
      *extra_bits = uVar1;
      uVar3 = uVar3 & 0xff;
    }
    return uVar3;
  }
LAB_00154039:
  stop_decoding(this,JPGD_DECODE_ERROR);
}

Assistant:

inline int jpeg_decoder::huff_decode(huff_tables* pH, int& extra_bits)
	{
		int symbol;

		if (!pH)
			stop_decoding(JPGD_DECODE_ERROR);

		// Check first 8-bits: do we have a complete symbol?
		if ((symbol = pH->look_up2[m_bit_buf >> 24]) < 0)
		{
			// Use a tree traversal to find symbol.
			int ofs = 23;
			do
			{
				unsigned int idx = -(int)(symbol + ((m_bit_buf >> ofs) & 1));

				// This should never happen, but to be safe I'm turning these asserts into a run-time check.
				if ((idx >= JPGD_HUFF_TREE_MAX_LENGTH) || (ofs < 0))
					stop_decoding(JPGD_DECODE_ERROR);

				symbol = pH->tree[idx];
				ofs--;
			} while (symbol < 0);

			get_bits_no_markers(8 + (23 - ofs));

			extra_bits = get_bits_no_markers(symbol & 0xF);
		}
		else
		{
			if (symbol & 0x8000)
			{
				//get_bits_no_markers((symbol >> 8) & 31);
				assert(((symbol >> 8) & 31) <= 15);
				get_bits_no_markers((symbol >> 8) & 15);
				extra_bits = symbol >> 16;
			}
			else
			{
				int code_size = (symbol >> 8) & 31;
				int num_extra_bits = symbol & 0xF;
				int bits = code_size + num_extra_bits;

				if (bits <= 16)
					extra_bits = get_bits_no_markers(bits) & ((1 << num_extra_bits) - 1);
				else
				{
					get_bits_no_markers(code_size);
					extra_bits = get_bits_no_markers(num_extra_bits);
				}
			}

			symbol &= 0xFF;
		}

		return symbol;
	}